

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

bool gguf_read_emplace_helper<bool>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  ssize_t sVar2;
  undefined3 in_register_00000009;
  uint in_register_0000000c;
  bool value;
  vector<bool,_std::allocator<bool>_> local_40;
  
  if (CONCAT31(in_register_00000009,is_array) == 0) {
    sVar2 = gguf_reader::read(gr,(int)&local_40,key,(ulong)in_register_0000000c << 0x20);
    if ((char)sVar2 == '\0') {
      return false;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<std::__cxx11::string_const&,bool&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,(bool *)&local_40);
  }
  else {
    local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    bVar1 = gguf_reader::read<bool>(gr,&local_40,n);
    if (bVar1) {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::vector<bool,std::allocator<bool>>&>
                ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,&local_40);
    }
    if (local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}